

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelFillsElement,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRelFillsElement *in;
  
  in = (IfcRelFillsElement *)operator_new(0xe0);
  *(undefined ***)&in->field_0xc8 = &PTR__Object_007e6a70;
  *(undefined8 *)&in->field_0xd0 = 0;
  *(char **)&in->field_0xd8 = "IfcRelFillsElement";
  Assimp::IFC::Schema_2x3::IfcRelConnects::IfcRelConnects
            ((IfcRelConnects *)in,&PTR_construction_vtable_24__007fa308);
  *(undefined8 *)&(in->super_IfcRelConnects).field_0xb0 = 0;
  (in->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelFillsElement_007fa250;
  *(undefined ***)&in->field_0xc8 = &PTR__IfcRelFillsElement_007fa2f0;
  *(undefined ***)&(in->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       &PTR__IfcRelFillsElement_007fa278;
  *(undefined ***)&(in->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       &PTR__IfcRelFillsElement_007fa2a0;
  *(undefined ***)&(in->super_IfcRelConnects).super_IfcRelationship.field_0xa8 =
       &PTR__IfcRelFillsElement_007fa2c8;
  *(undefined8 *)&(in->super_IfcRelConnects).field_0xb8 = 0;
  (in->RelatedBuildingElement).obj = (LazyObject *)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelFillsElement>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
         (long)(in->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }